

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsim_context.cpp
# Opt level: O2

ModelCircuit * __thiscall
lsim::LSimContext::find_circuit(LSimContext *this,char *name,ModelCircuitLibrary *fallback_lib)

{
  long lVar1;
  iterator iVar2;
  ModelCircuit *pMVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> lib_name;
  string qualified;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> circuit_name;
  
  std::__cxx11::string::string((string *)&qualified,name,(allocator *)&lib_name);
  lVar1 = std::__cxx11::string::find((char)&qualified,0x2e);
  if (lVar1 == -1) {
    if (fallback_lib != (ModelCircuitLibrary *)0x0) {
      pMVar3 = ModelCircuitLibrary::circuit_by_name(fallback_lib,name);
      if (pMVar3 != (ModelCircuit *)0x0) goto LAB_001594d6;
    }
    pMVar3 = ModelCircuitLibrary::circuit_by_name(&this->m_user_library,name);
  }
  else {
    std::__cxx11::string::substr((ulong)&lib_name,(ulong)&qualified);
    std::__cxx11::string::substr((ulong)&circuit_name,(ulong)&qualified);
    iVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->m_reference_libraries)._M_h,&lib_name);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      pMVar3 = (ModelCircuit *)0x0;
    }
    else {
      pMVar3 = ModelCircuitLibrary::circuit_by_name
                         (*(ModelCircuitLibrary **)
                           ((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_true>
                                  ._M_cur + 0x28),circuit_name._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)&circuit_name);
    std::__cxx11::string::~string((string *)&lib_name);
  }
LAB_001594d6:
  std::__cxx11::string::~string((string *)&qualified);
  return pMVar3;
}

Assistant:

ModelCircuit *LSimContext::find_circuit(const char *name, ModelCircuitLibrary *fallback_lib) {
    std::string qualified = name;
    auto separator = qualified.find_first_of('.');

    if (separator == std::string::npos) {
        ModelCircuit *result = nullptr;
        if (fallback_lib != nullptr) {
            result = fallback_lib->circuit_by_name(name);
        }
        if (result == nullptr) {
            result = m_user_library.circuit_by_name(name);
        }
        return result;
    }

    auto lib_name = qualified.substr(0, separator);
    auto circuit_name = qualified.substr(separator+1);

    auto found = m_reference_libraries.find(lib_name);
    if (found != m_reference_libraries.end()) {
        return found->second->circuit_by_name(circuit_name.c_str());
    }

    return nullptr;
}